

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_wbl.c
# Opt level: O0

void beltWBLStepDOpt(void *buf,size_t count,void *state)

{
  u32 *in_RDX;
  ulong uVar1;
  ulong in_RSI;
  undefined8 *in_RDI;
  size_t i;
  word n;
  belt_wbl_st *st;
  ulong local_30;
  
  *(undefined8 *)(in_RDX + 0xc) = *in_RDI;
  *(undefined8 *)(in_RDX + 0xe) = in_RDI[1];
  for (local_30 = 0x10; local_30 + 0x20 < in_RSI; local_30 = local_30 + 0x10) {
    *(ulong *)(in_RDX + 0xc) = *(ulong *)((long)in_RDI + local_30) ^ *(ulong *)(in_RDX + 0xc);
    *(ulong *)(in_RDX + 0xe) = *(ulong *)((long)in_RDI + local_30 + 8) ^ *(ulong *)(in_RDX + 0xe);
  }
  *(ulong *)(in_RDX + 0x10) = (in_RSI + 0xf >> 4) << 1;
  local_30 = in_RSI - 0x10;
  while (*(long *)(in_RDX + 0x10) != 0) {
    *(undefined8 *)(in_RDX + 8) = *(undefined8 *)((long)in_RDI + local_30);
    *(undefined8 *)(in_RDX + 10) = *(undefined8 *)((long)in_RDI + local_30 + 8);
    beltBlockEncr((octet *)(in_RDX + 8),in_RDX);
    memXor2(in_RDX + 8,in_RDX + 0x10,8);
    uVar1 = ((local_30 + in_RSI) - 0x10) % in_RSI;
    *(ulong *)((long)in_RDI + uVar1) = *(ulong *)(in_RDX + 8) ^ *(ulong *)((long)in_RDI + uVar1);
    uVar1 = ((local_30 + in_RSI) - 0x10) % in_RSI;
    *(ulong *)((long)in_RDI + uVar1 + 8) =
         *(ulong *)(in_RDX + 10) ^ *(ulong *)((long)in_RDI + uVar1 + 8);
    *(ulong *)((long)in_RDI + local_30) =
         *(ulong *)(in_RDX + 0xc) ^ *(ulong *)((long)in_RDI + local_30);
    *(ulong *)((long)in_RDI + local_30 + 8) =
         *(ulong *)(in_RDX + 0xe) ^ *(ulong *)((long)in_RDI + local_30 + 8);
    *(ulong *)(in_RDX + 0xc) =
         *(ulong *)((long)in_RDI + ((local_30 + in_RSI) - 0x20) % in_RSI) ^ *(ulong *)(in_RDX + 0xc)
    ;
    *(ulong *)(in_RDX + 0xe) =
         *(ulong *)((long)in_RDI + ((local_30 + in_RSI) - 0x20) % in_RSI + 8) ^
         *(ulong *)(in_RDX + 0xe);
    *(ulong *)(in_RDX + 0xc) = *(ulong *)((long)in_RDI + local_30) ^ *(ulong *)(in_RDX + 0xc);
    *(ulong *)(in_RDX + 0xe) = *(ulong *)((long)in_RDI + local_30 + 8) ^ *(ulong *)(in_RDX + 0xe);
    local_30 = ((local_30 + in_RSI) - 0x10) % in_RSI;
    *(long *)(in_RDX + 0x10) = *(long *)(in_RDX + 0x10) + -1;
  }
  return;
}

Assistant:

void beltWBLStepDOpt(void* buf, size_t count, void* state)
{
	belt_wbl_st* st = (belt_wbl_st*)state;
	word n = ((word)count + 15) / 16;
	size_t i;
	ASSERT(count >= 32 && count % 16 == 0);
	ASSERT(memIsDisjoint2(buf, count, state, beltWBL_keep()));
	// sum <- r1 + ... + r_{n-2} (будущая сумма r2 + ... + r_{n-1})
	beltBlockCopy(st->sum, (octet*)buf);
	for (i = 16; i + 32 < count; i += 16)
		beltBlockXor2(st->sum, (octet*)buf + i);
	// 2 * n итераций (sum будет записываться по смещению i: 
	// это блок r* в начале такта и блок r1 в конце)
	for (st->round = 2 * n, i = count - 16; st->round; --st->round)
	{
		// block <- beltBlockEncr(r*) + <round>
		beltBlockCopy(st->block, (octet*)buf + i);
		beltBlockEncr(st->block, st->key);
#if (OCTET_ORDER == LITTLE_ENDIAN)
		memXor2(st->block, &st->round, O_PER_W);
#else // BIG_ENDIAN
		st->round = wordRev(st->round);
		memXor2(st->block, &st->round, O_PER_W);
		st->round = wordRev(st->round);
#endif // OCTET_ORDER
		// r* <- r* + block
		beltBlockXor2((octet*)buf + (i + count - 16) % count, st->block);
		// r1 <- pre r* + sum
		beltBlockXor2((octet*)buf + i, st->sum);
		// пересчитать sum: исключить старое слагаемое
		beltBlockXor2(st->sum, (octet*)buf + (i + count - 32) % count);
		// пересчитать sum: добавить новое слагаемое
		beltBlockXor2(st->sum, (octet*)buf + i);
		// назад
		i = (i + count - 16) % count;
	}
}